

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_remove
          (DynamicPartialIndex *this,vertex_t s,vertex_t t,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  byte *pbVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *reverse_graph_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *graph_local;
  vertex_t t_local;
  vertex_t s_local;
  DynamicPartialIndex *this_local;
  
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if ((*pbVar2 < this->k_) &&
     (pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)t),
     *pbVar2 <= this->k_)) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
    bVar1 = *pbVar2;
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)t);
    if (bVar1 + 1 == (uint)*pbVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(this->updated_);
      collect_changes(this,t,graph,reverse_graph,dist);
      fix_changes(this,graph,reverse_graph,dist);
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_remove(vertex_t s, vertex_t t,
                                                               const std::vector<std::vector<vertex_t>> &graph,
                                                               const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                               std::vector<distance_t> &dist) {
    if (dist.at(s) >= k_ || dist.at(t) > k_ || dist.at(s) + 1 != dist.at(t)) {
        return;
    }
    updated_.clear();
    collect_changes(t, graph, reverse_graph, dist);
    fix_changes(graph, reverse_graph, dist);
}